

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

void benchmark<unsigned_long>(tasks_t tasks,size_t max,size_t iters)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  result_t rVar4;
  double local_60;
  double local_58;
  double local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dividers;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"----- ");
  poVar1 = std::operator<<(poVar1,"u64");
  poVar1 = std::operator<<(poVar1," -----");
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((tasks & 0x40) == 0) {
    rVar4 = (result_t)ZEXT816(0);
  }
  else {
    get_primes<unsigned_long,unsigned_long>(&dividers,max);
    rVar4 = benchmark_sum_dividers<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      (&dividers,iters);
    std::operator<<((ostream *)&std::cout,'.');
    std::ostream::flush();
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&dividers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  uVar3 = rVar4.sum;
  local_58 = rVar4.duration;
  if ((tasks >> 8 & 1) == 0) {
    rVar4 = (result_t)ZEXT816(0);
  }
  else {
    get_primes<libdivide::divider<unsigned_long,(libdivide::Branching)0>,unsigned_long>
              ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                *)&dividers,max);
    rVar4 = benchmark_sum_dividers<unsigned_long,std::vector<libdivide::divider<unsigned_long,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_long,(libdivide::Branching)0>>>>
                      ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                        *)&dividers,iters);
    std::operator<<((ostream *)&std::cout,'.');
    std::ostream::flush();
    std::
    _Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
    ::~_Vector_base((_Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)0>_>_>
                     *)&dividers);
  }
  uVar2 = rVar4.sum;
  local_50 = rVar4.duration;
  if ((char)tasks < '\0') {
    get_primes<libdivide::divider<unsigned_long,(libdivide::Branching)1>,unsigned_long>
              ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
                *)&dividers,max);
    rVar4 = benchmark_sum_dividers<unsigned_long,std::vector<libdivide::divider<unsigned_long,(libdivide::Branching)1>,std::allocator<libdivide::divider<unsigned_long,(libdivide::Branching)1>>>>
                      ((vector<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
                        *)&dividers,iters);
    poVar1 = std::operator<<((ostream *)&std::cout,'.');
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    _Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
    ::~_Vector_base((_Vector_base<libdivide::divider<unsigned_long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_long,_(libdivide::Branching)1>_>_>
                     *)&dividers);
  }
  else {
    rVar4 = (result_t)ZEXT816(0);
  }
  local_60 = rVar4.duration;
  if (((~tasks & 0x140) == 0) && (uVar2 != uVar3)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: branchfull_divider<");
    poVar1 = std::operator<<(poVar1,"u64");
    poVar1 = std::operator<<(poVar1,"> sum: ");
  }
  else {
    if (((~tasks & 0xc0) != 0) || (rVar4.sum == uVar3)) {
      if ((tasks & 0x40) != 0) {
        std::operator<<((ostream *)&std::cout,"    system: ");
        poVar1 = std::ostream::_M_insert<double>(local_58);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      if ((tasks >> 8 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"branchfull: ");
        poVar1 = std::ostream::_M_insert<double>(local_50);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      if ((char)tasks < '\0') {
        std::operator<<((ostream *)&std::cout,"branchfree: ");
        poVar1 = std::ostream::_M_insert<double>(local_60);
        poVar1 = std::operator<<(poVar1," seconds");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: branchfree_divider<");
    poVar1 = std::operator<<(poVar1,"u64");
    poVar1 = std::operator<<(poVar1,"> sum: ");
    uVar2 = rVar4.sum;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,", but system sum: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void benchmark(tasks_t tasks, size_t max, size_t iters) {
    std::cout << "----- " << type_tag<T>::get_tag() << " -----" << std::endl;

    bool test_system = !!(tasks & TEST_SYSTEM);
    bool test_branchfull = !!(tasks & TEST_BRANCHFULL);
    bool test_branchfree = !!(tasks & TEST_BRANCHFREE);

    result_t sys = {0, 0};
    result_t branchfull = {0, 0};
    result_t branchfree = {0, 0};

    size_t st_max = std::min(max, (size_t)std::numeric_limits<T>::max());
    iters = iters * (max / st_max);
    T t_max = (T)st_max;
    if (test_system) {
        using divider_type = T;
        auto dividers = get_primes<divider_type>(t_max);
        sys = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfull) {
        using divider_type = libdivide::divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfull = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfree) {
        using divider_type = libdivide::branchfree_divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfree = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::endl;
    }

    if (test_system && test_branchfull && branchfull.sum != sys.sum) {
        std::cerr << "Error: branchfull_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfull.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system && test_branchfree && branchfree.sum != sys.sum) {
        std::cerr << "Error: branchfree_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfree.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system) std::cout << "    system: " << sys.duration << " seconds" << std::endl;
    if (test_branchfull)
        std::cout << "branchfull: " << branchfull.duration << " seconds" << std::endl;
    if (test_branchfree)
        std::cout << "branchfree: " << branchfree.duration << " seconds" << std::endl;

    std::cout << std::endl;
}